

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleMesh.cpp
# Opt level: O1

void __thiscall
btTriangleMesh::btTriangleMesh(btTriangleMesh *this,bool use32bitIndices,bool use4componentVertices)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  btIndexedMesh *pbVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  btAlignedObjectArray<unsigned_int> *pbVar11;
  btStridingMeshInterface *pbVar12;
  int iVar13;
  btIndexedMesh *pbVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  
  (this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface.m_scaling.m_floats[0] = 1.0
  ;
  (this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface.m_scaling.m_floats[1] = 1.0
  ;
  pbVar12 = &(this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface;
  (pbVar12->m_scaling).m_floats[2] = 1.0;
  (pbVar12->m_scaling).m_floats[3] = 0.0;
  (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory = true;
  (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data = (btIndexedMesh *)0x0;
  (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_size = 0;
  (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_capacity = 0;
  (this->super_btTriangleIndexVertexArray).m_hasAabb = 0;
  (this->super_btTriangleIndexVertexArray).super_btStridingMeshInterface.
  _vptr_btStridingMeshInterface = (_func_int **)&PTR__btTriangleMesh_00226dc0;
  (this->m_4componentVertices).m_ownsMemory = true;
  (this->m_4componentVertices).m_data = (btVector3 *)0x0;
  (this->m_4componentVertices).m_size = 0;
  (this->m_4componentVertices).m_capacity = 0;
  (this->m_3componentVertices).m_ownsMemory = true;
  (this->m_3componentVertices).m_data = (float *)0x0;
  (this->m_3componentVertices).m_size = 0;
  (this->m_3componentVertices).m_capacity = 0;
  (this->m_32bitIndices).m_ownsMemory = true;
  (this->m_32bitIndices).m_data = (uint *)0x0;
  (this->m_32bitIndices).m_size = 0;
  (this->m_32bitIndices).m_capacity = 0;
  (this->m_16bitIndices).m_ownsMemory = true;
  (this->m_16bitIndices).m_data = (unsigned_short *)0x0;
  (this->m_16bitIndices).m_size = 0;
  (this->m_16bitIndices).m_capacity = 0;
  this->m_use32bitIndices = use32bitIndices;
  this->m_use4componentVertices = use4componentVertices;
  this->m_weldingThreshold = 0.0;
  iVar16 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_size;
  iVar13 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_capacity;
  if (iVar16 == iVar13) {
    iVar18 = 1;
    if (iVar16 != 0) {
      iVar18 = iVar16 * 2;
    }
    if (iVar13 < iVar18) {
      if (iVar18 == 0) {
        pbVar14 = (btIndexedMesh *)0x0;
      }
      else {
        pbVar14 = (btIndexedMesh *)btAlignedAllocInternal((long)iVar18 * 0x30,0x10);
      }
      lVar15 = (long)(this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_size;
      if (0 < lVar15) {
        lVar17 = 0;
        do {
          pbVar5 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
          puVar2 = (undefined8 *)((long)&pbVar5->m_numTriangles + lVar17);
          uVar6 = *puVar2;
          uVar7 = puVar2[1];
          puVar2 = (undefined8 *)((long)&pbVar5->m_triangleIndexStride + lVar17);
          uVar8 = *puVar2;
          uVar9 = puVar2[1];
          puVar2 = (undefined8 *)((long)&pbVar5->m_vertexStride + lVar17);
          uVar10 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pbVar14->m_vertexStride + lVar17);
          *puVar3 = *puVar2;
          puVar3[1] = uVar10;
          puVar2 = (undefined8 *)((long)&pbVar14->m_triangleIndexStride + lVar17);
          *puVar2 = uVar8;
          puVar2[1] = uVar9;
          puVar2 = (undefined8 *)((long)&pbVar14->m_numTriangles + lVar17);
          *puVar2 = uVar6;
          puVar2[1] = uVar7;
          lVar17 = lVar17 + 0x30;
        } while (lVar15 * 0x30 != lVar17);
      }
      pbVar5 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
      if (pbVar5 != (btIndexedMesh *)0x0) {
        if ((this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory == true) {
          btAlignedFreeInternal(pbVar5);
        }
        (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data = (btIndexedMesh *)0x0;
      }
      (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_ownsMemory = true;
      (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data = pbVar14;
      (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_capacity = iVar18;
    }
  }
  pbVar14 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
  iVar16 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_size;
  pbVar14[iVar16].m_numTriangles = 0;
  pbVar14[iVar16].m_triangleIndexBase = (uchar *)0x0;
  pbVar14[iVar16].m_triangleIndexStride = 0xc;
  pbVar14[iVar16].m_numVertices = 0;
  pbVar14[iVar16].m_vertexBase = (uchar *)0x0;
  pbVar14[iVar16].m_vertexStride = 0x10;
  pbVar14[iVar16].m_indexType = PHY_INTEGER;
  pbVar14[iVar16].m_vertexType = PHY_FLOAT;
  piVar1 = &(this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_size;
  *piVar1 = *piVar1 + 1;
  bVar4 = this->m_use32bitIndices;
  pbVar14 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
  iVar13 = 0xc;
  iVar16 = 6;
  pbVar11 = (btAlignedObjectArray<unsigned_int> *)&this->m_16bitIndices;
  if (bVar4 != PHY_FLOAT) {
    iVar16 = 0xc;
    pbVar11 = &this->m_32bitIndices;
  }
  pbVar14->m_numTriangles = pbVar11->m_size / 3;
  pbVar14->m_triangleIndexBase = (uchar *)0x0;
  pbVar14->m_indexType = bVar4 ^ PHY_SHORT;
  pbVar14->m_triangleIndexStride = iVar16;
  if (this->m_use4componentVertices == false) {
    iVar16 = (this->m_3componentVertices).m_size / 3;
  }
  else {
    iVar16 = (this->m_4componentVertices).m_size;
    iVar13 = 0x10;
  }
  pbVar14 = (this->super_btTriangleIndexVertexArray).m_indexedMeshes.m_data;
  pbVar14->m_numVertices = iVar16;
  pbVar14->m_vertexBase = (uchar *)0x0;
  pbVar14->m_vertexStride = iVar13;
  return;
}

Assistant:

btTriangleMesh::btTriangleMesh (bool use32bitIndices,bool use4componentVertices)
:m_use32bitIndices(use32bitIndices),
m_use4componentVertices(use4componentVertices),
m_weldingThreshold(0.0)
{
	btIndexedMesh meshIndex;
	meshIndex.m_numTriangles = 0;
	meshIndex.m_numVertices = 0;
	meshIndex.m_indexType = PHY_INTEGER;
	meshIndex.m_triangleIndexBase = 0;
	meshIndex.m_triangleIndexStride = 3*sizeof(int);
	meshIndex.m_vertexBase = 0;
	meshIndex.m_vertexStride = sizeof(btVector3);
	m_indexedMeshes.push_back(meshIndex);

	if (m_use32bitIndices)
	{
		m_indexedMeshes[0].m_numTriangles = m_32bitIndices.size()/3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_INTEGER;
		m_indexedMeshes[0].m_triangleIndexStride = 3*sizeof(int);
	} else
	{
		m_indexedMeshes[0].m_numTriangles = m_16bitIndices.size()/3;
		m_indexedMeshes[0].m_triangleIndexBase = 0;
		m_indexedMeshes[0].m_indexType = PHY_SHORT;
		m_indexedMeshes[0].m_triangleIndexStride = 3*sizeof(short int);
	}

	if (m_use4componentVertices)
	{
		m_indexedMeshes[0].m_numVertices = m_4componentVertices.size();
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = sizeof(btVector3);
	} else
	{
		m_indexedMeshes[0].m_numVertices = m_3componentVertices.size()/3;
		m_indexedMeshes[0].m_vertexBase = 0;
		m_indexedMeshes[0].m_vertexStride = 3*sizeof(btScalar);
	}


}